

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O3

void __thiscall mocker::ir::Reg::~Reg(Reg *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Addr)._vptr_Addr = (_func_int **)&PTR__Reg_001249a0;
  pcVar2 = (this->identifier)._M_dataplus._M_p;
  paVar1 = &(this->identifier).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Reg(std::string identifier) : identifier(std::move(identifier)) {}